

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

int __thiscall Bitmap::drawText(Bitmap *this,int32_t x,int32_t y,char *text)

{
  int iVar1;
  int32_t pixel_00;
  int32_t pixel_01;
  byte *pbVar2;
  bool local_39;
  int32_t origin;
  int iStack_34;
  bool status;
  int character;
  int32_t width;
  int32_t pixel;
  int32_t cursor;
  char *text_local;
  int32_t y_local;
  int32_t x_local;
  Bitmap *this_local;
  
  if (this->font == (GFXfont *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    iStack_34 = 0;
    width = x;
    _pixel = (byte *)text;
    while( true ) {
      pbVar2 = _pixel + 1;
      if (*_pixel == 0) break;
      iVar1 = Utf8Decoder::decode(&this->utf8,(uint)*_pixel);
      _pixel = pbVar2;
      if (0 < iVar1) {
        pixel_00 = getPixelIndex(this,width,y);
        iVar1 = GlyphIterator::init(this->glyphIterator,(EVP_PKEY_CTX *)this->font);
        local_39 = (bool)((byte)iVar1 & 1);
        while (local_39 != false) {
          pixel_01 = getPixelIndex(this,pixel_00,this->glyphIterator->xOffset,
                                   this->glyphIterator->yOffset);
          if (-1 < pixel_01) {
            setPixelValue(this,pixel_01,(bool)(this->glyphIterator->value & 1));
          }
          local_39 = GlyphIterator::next(this->glyphIterator);
        }
        width = this->glyphIterator->xAdvance + width;
        iStack_34 = this->glyphIterator->xAdvance + iStack_34;
      }
    }
    this_local._4_4_ = iStack_34;
  }
  return this_local._4_4_;
}

Assistant:

int Bitmap::drawText(const int32_t x, const int32_t y, const char * text)
{
   int32_t cursor;
   int32_t pixel;
   int32_t width;
   int character;
   bool status;

   if (this->font == nullptr)
   {
      return -1;
   }

   width = 0;
   cursor = x;
   while ((character = (uint8_t)(*text++)) != 0)
   {
      //handle utf8 characters
      character = utf8.decode(character);
      //only for ASCII chars in range 1 ..127 and the suported UTF8 onces. Others will be skipped!
      if (character > 0)
      {
         //draw pixel for pixel of character
         const int32_t origin = getPixelIndex(cursor, y);
         status = glyphIterator->init(this->font, character);
         while (status)
         {
            //calculate pixel index to be set to the respective value
            pixel = getPixelIndex(origin, glyphIterator->xOffset, glyphIterator->yOffset);
            if (pixel >= 0)
            {
               //set pixel to its value
               setPixelValue(pixel, glyphIterator->value);
            }
            //select next pixel
            status = glyphIterator->next();
         }

         //increment cursor
         cursor += glyphIterator->xAdvance;
         width += glyphIterator->xAdvance;
      }
   }

   return width;
}